

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::AddError(cmCursesMainForm *this,char *message,char *param_2)

{
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,message,&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Errors,
             &local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmCursesMainForm::AddError(const char* message, const char*)
{
  this->Errors.push_back(message);
}